

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyramid.c
# Opt level: O0

size_t aom_get_pyramid_alloc_size(int width,int height,_Bool image_is_16bit)

{
  byte in_DL;
  uint in_ESI;
  uint in_EDI;
  int level_stride;
  int padded_height;
  int padded_width;
  int level_height;
  int level_width;
  int level;
  int first_allocated_level;
  size_t extra_bytes;
  size_t first_px_offset;
  size_t buffer_size;
  size_t alloc_size;
  int n_levels;
  int msb;
  int local_5c;
  uint local_58;
  uint local_40;
  long local_28;
  
  local_58 = in_ESI;
  if ((int)in_EDI < (int)in_ESI) {
    local_58 = in_EDI;
  }
  local_5c = get_msb(local_58);
  if (local_5c + -3 < 2) {
    local_5c = 1;
  }
  else {
    local_5c = local_5c + -3;
  }
  local_28 = 0x10;
  for (local_40 = (uint)((in_DL & 1) == 0); (int)local_40 < local_5c; local_40 = local_40 + 1) {
    local_28 = (int)((((int)in_EDI >> ((byte)local_40 & 0x1f)) + 0x3fU & 0xffffffe0) *
                    (((int)in_ESI >> ((byte)local_40 & 0x1f)) + 0x20)) + local_28;
  }
  return local_28 + (long)local_5c * 0x18 + 0x40;
}

Assistant:

size_t aom_get_pyramid_alloc_size(int width, int height, bool image_is_16bit) {
  // Allocate the maximum possible number of layers for this width and height
  const int msb = get_msb(AOMMIN(width, height));
  const int n_levels = AOMMAX(msb - MIN_PYRAMID_SIZE_LOG2, 1);

  size_t alloc_size = 0;
  alloc_size += sizeof(ImagePyramid);
  alloc_size += n_levels * sizeof(PyramidLayer);

  // Calculate how much memory is needed for downscaled frame buffers
  size_t buffer_size = 0;

  // Work out if we need to allocate a few extra bytes for alignment.
  // aom_memalign() will ensure that the start of the allocation is aligned
  // to a multiple of PYRAMID_ALIGNMENT. But we want the first image pixel
  // to be aligned, not the first byte of the allocation.
  //
  // In the loop below, we ensure that the stride of every image is a multiple
  // of PYRAMID_ALIGNMENT. Thus the allocated size of each pyramid level will
  // also be a multiple of PYRAMID_ALIGNMENT. Thus, as long as we can get the
  // first pixel in the first pyramid layer aligned properly, that will
  // automatically mean that the first pixel of every row of every layer is
  // properly aligned too.
  //
  // Thus all we need to consider is the first pixel in the first layer.
  // This is located at offset
  //   extra_bytes + level_stride * PYRAMID_PADDING + PYRAMID_PADDING
  // bytes into the buffer. Since level_stride is a multiple of
  // PYRAMID_ALIGNMENT, we can ignore that. So we need
  //   extra_bytes + PYRAMID_PADDING = multiple of PYRAMID_ALIGNMENT
  //
  // To solve this, we can round PYRAMID_PADDING up to the next multiple
  // of PYRAMID_ALIGNMENT, then subtract the orginal value to calculate
  // how many extra bytes are needed.
  size_t first_px_offset =
      (PYRAMID_PADDING + PYRAMID_ALIGNMENT - 1) & ~(PYRAMID_ALIGNMENT - 1);
  size_t extra_bytes = first_px_offset - PYRAMID_PADDING;
  buffer_size += extra_bytes;

  // If the original image is stored in an 8-bit buffer, then we can point the
  // lowest pyramid level at that buffer rather than allocating a new one.
  int first_allocated_level = image_is_16bit ? 0 : 1;

  for (int level = first_allocated_level; level < n_levels; level++) {
    int level_width = width >> level;
    int level_height = height >> level;

    // Allocate padding for each layer
    int padded_width = level_width + 2 * PYRAMID_PADDING;
    int padded_height = level_height + 2 * PYRAMID_PADDING;

    // Align the layer stride to be a multiple of PYRAMID_ALIGNMENT
    // This ensures that, as long as the top-left pixel in this pyramid level is
    // properly aligned, then so will the leftmost pixel in every row of the
    // pyramid level.
    int level_stride =
        (padded_width + PYRAMID_ALIGNMENT - 1) & ~(PYRAMID_ALIGNMENT - 1);

    buffer_size += level_stride * padded_height;
  }

  alloc_size += buffer_size;

  return alloc_size;
}